

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O0

bool __thiscall
DIS::ArealObjectStatePdu::operator==(ArealObjectStatePdu *this,ArealObjectStatePdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  ArealObjectStatePdu *rhs_local;
  ArealObjectStatePdu *this_local;
  
  idx._7_1_ = SyntheticEnvironmentFamilyPdu::operator==
                        (&this->super_SyntheticEnvironmentFamilyPdu,
                         &rhs->super_SyntheticEnvironmentFamilyPdu);
  bVar1 = EntityID::operator==(&this->_objectID,&rhs->_objectID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = EntityID::operator==(&this->_referencedObjectID,&rhs->_referencedObjectID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_updateNumber != rhs->_updateNumber) {
    idx._7_1_ = false;
  }
  if (this->_forceID != rhs->_forceID) {
    idx._7_1_ = false;
  }
  if (this->_modifications != rhs->_modifications) {
    idx._7_1_ = false;
  }
  bVar1 = EntityType::operator==(&this->_objectType,&rhs->_objectType);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = SixByteChunk::operator==(&this->_objectAppearance,&rhs->_objectAppearance);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = SimulationAddress::operator==(&this->_requesterID,&rhs->_requesterID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = SimulationAddress::operator==(&this->_receivingID,&rhs->_receivingID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::size
                      (&this->_objectLocation);
    if (sVar2 <= local_28) break;
    this_00 = std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::operator[]
                        (&this->_objectLocation,local_28);
    rhs_00 = std::vector<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>::operator[]
                       (&rhs->_objectLocation,local_28);
    bVar1 = Vector3Double::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool ArealObjectStatePdu::operator ==(const ArealObjectStatePdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = SyntheticEnvironmentFamilyPdu::operator==(rhs);

     if( ! (_objectID == rhs._objectID) ) ivarsEqual = false;
     if( ! (_referencedObjectID == rhs._referencedObjectID) ) ivarsEqual = false;
     if( ! (_updateNumber == rhs._updateNumber) ) ivarsEqual = false;
     if( ! (_forceID == rhs._forceID) ) ivarsEqual = false;
     if( ! (_modifications == rhs._modifications) ) ivarsEqual = false;
     if( ! (_objectType == rhs._objectType) ) ivarsEqual = false;
     if( ! (_objectAppearance == rhs._objectAppearance) ) ivarsEqual = false;
     if( ! (_requesterID == rhs._requesterID) ) ivarsEqual = false;
     if( ! (_receivingID == rhs._receivingID) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _objectLocation.size(); idx++)
     {
        if( ! ( _objectLocation[idx] == rhs._objectLocation[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }